

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *window,ImGuiAxis axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  uint uVar5;
  ImVec2 IVar6;
  float fVar7;
  ImRect IVar8;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  
  IVar8 = ImGuiWindow::Rect(window);
  fVar1 = window->WindowBorderSize;
  fVar2 = (window->InnerRect).Min.x;
  fVar3 = (window->InnerRect).Min.y;
  local_68 = (window->InnerRect).Max.x;
  fStack_64 = (window->InnerRect).Max.y;
  pfVar4 = ImVec2::operator[](&window->ScrollbarSizes,(long)(axis ^ ImGuiAxis_Y));
  fVar7 = *pfVar4;
  if (0.0 < fVar7) {
    if (axis == ImGuiAxis_X) {
      fStack_74 = IVar8.Min.y;
      fStack_64 = IVar8.Max.y;
      fVar7 = (fStack_64 - fVar1) - fVar7;
      uVar5 = -(uint)(fVar7 <= fStack_74);
      IVar6.y = (float)(uVar5 & (uint)fStack_74 | ~uVar5 & (uint)fVar7);
      IVar6.x = fVar2;
    }
    else {
      local_68 = IVar8.Max.x;
      fVar7 = (local_68 - fVar1) - fVar7;
      local_78 = IVar8.Min.x;
      uVar5 = -(uint)(fVar7 <= local_78);
      IVar6.x = (float)(uVar5 & (uint)local_78 | ~uVar5 & (uint)fVar7);
      IVar6.y = fVar3;
    }
    IVar8.Max.y = fStack_64;
    IVar8.Max.x = local_68;
    IVar8.Min = IVar6;
    return IVar8;
  }
  __assert_fail("scrollbar_size > 0.0f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_widgets.cpp"
                ,0x36b,"ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *, ImGuiAxis)");
}

Assistant:

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow* window, ImGuiAxis axis)
{
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1]; // (ScrollbarSizes.x = width of Y scrollbar; ScrollbarSizes.y = height of X scrollbar)
    IM_ASSERT(scrollbar_size > 0.0f);
    if (axis == ImGuiAxis_X)
        return ImRect(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size), inner_rect.Max.x, outer_rect.Max.y);
    else
        return ImRect(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y, outer_rect.Max.x, inner_rect.Max.y);
}